

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

uint8_t wasm::parseLaneIndex(Element *s,size_t lanes)

{
  ParseException *pPVar1;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_75;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  unsigned_long_long n;
  char *end;
  const_pointer local_20;
  char *str;
  size_t lanes_local;
  Element *s_local;
  
  str = (char *)lanes;
  lanes_local = (size_t)s;
  _end = (string_view)Element::str(s);
  local_20 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&end);
  local_40 = (char *)strtoll(local_20,(char **)&n,10);
  if (((const_pointer)n != local_20) && (*(char *)n == '\0')) {
    if (str < local_40) {
      pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
      std::__cxx11::to_string(&local_b8,(unsigned_long)str);
      std::operator+(&local_98,"lane index must be less than ",&local_b8);
      ParseException::ParseException
                (pPVar1,&local_98,*(size_t *)(lanes_local + 0x40),*(size_t *)(lanes_local + 0x48));
      __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
    }
    return (uint8_t)local_40;
  }
  local_75 = 1;
  pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Expected lane index",&local_61);
  ParseException::ParseException
            (pPVar1,&local_60,*(size_t *)(lanes_local + 0x40),*(size_t *)(lanes_local + 0x48));
  local_75 = 0;
  __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

static uint8_t parseLaneIndex(const Element* s, size_t lanes) {
  const char* str = s->str().str.data();
  char* end;
  auto n = static_cast<unsigned long long>(strtoll(str, &end, 10));
  if (end == str || *end != '\0') {
    throw ParseException("Expected lane index", s->line, s->col);
  }
  if (n > lanes) {
    throw ParseException(
      "lane index must be less than " + std::to_string(lanes), s->line, s->col);
  }
  return uint8_t(n);
}